

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O2

Expression *
slang::ast::BinaryExpression::fromComponents
          (Expression *lhs,Expression *rhs,BinaryOperator op,SourceRange opRange,
          SourceRange sourceRange,ASTContext *context)

{
  Compilation *compilation;
  SourceLocation SVar1;
  SourceRange sourceRange_00;
  SourceRange opRange_00;
  SourceRange opRange_01;
  SourceRange opRange_02;
  SourceRange opRange_03;
  SourceRange opRange_04;
  SourceRange opRange_05;
  SourceRange opRange_06;
  SourceRange sourceRange_01;
  SourceRange sourceRange_02;
  SourceRange range;
  SourceRange sourceRange_03;
  undefined8 uVar2;
  bool bVar3;
  char cVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  BinaryExpression *expr;
  undefined7 extraout_var;
  Type *pTVar8;
  Compilation *pCVar9;
  BinaryExpression *pBVar10;
  BinaryExpression *pBVar11;
  Expression *pEVar12;
  Type *pTVar13;
  Diagnostic *pDVar14;
  Diagnostic *pDVar15;
  Type *pTVar16;
  Type *forceType;
  Type *forceType_00;
  SourceLocation *pSVar17;
  BinaryOperator BVar18;
  char *pcVar19;
  undefined4 uVar20;
  DiagCode code;
  Compilation *pCVar21;
  size_t sVar22;
  SourceRange *pSVar23;
  BinaryExpression *pBVar24;
  UnaryExpression *unary;
  SourceRange range_00;
  SourceRange range_01;
  SourceRange range_02;
  string_view sVar25;
  string_view arg;
  string_view arg_00;
  SourceRange range_03;
  string_view arg_01;
  string_view arg_02;
  string_view arg_03;
  string_view arg_04;
  undefined4 uVar26;
  SourceLocation in_stack_fffffffffffffed0;
  Compilation *local_128;
  undefined1 local_fc [12];
  SourceRange opRange_local;
  BinaryOperator op_local;
  anon_class_1_0_00000001 local_d1;
  Expression *local_d0;
  Type *rt;
  Type *lt;
  SourceRange local_b8;
  char *local_a8;
  size_t local_a0;
  SourceLocation local_98;
  SourceLocation *local_90;
  anon_class_24_3_21991733 check;
  anon_class_24_3_e32f0a13 warnAWithinB;
  
  opRange_local.endLoc = opRange.endLoc;
  opRange_local.startLoc = opRange.startLoc;
  pSVar23 = &opRange_local;
  compilation = ((context->scope).ptr)->compilation;
  local_128 = (Compilation *)(lhs->type).ptr;
  pTVar13 = (rhs->type).ptr;
  op_local = op;
  rt = pTVar13;
  lt = (Type *)local_128;
  expr = BumpAllocator::
         emplace<slang::ast::BinaryExpression,slang::ast::BinaryOperator&,slang::ast::Type_const&,slang::ast::Expression&,slang::ast::Expression&,slang::SourceRange&,slang::SourceRange&>
                   (&compilation->super_BumpAllocator,&op_local,(Type *)local_128,lhs,rhs,
                    &sourceRange,pSVar23);
  bVar3 = Expression::bad(lhs);
  if ((bVar3) || (bVar3 = Expression::bad(rhs), bVar3)) goto LAB_00634589;
  bVar3 = Type::isUnbounded((Type *)local_128);
  if (bVar3) {
    local_128 = (Compilation *)compilation->intType;
    lt = (Type *)local_128;
  }
  bVar3 = Type::isUnbounded(pTVar13);
  if (bVar3) {
    pTVar13 = compilation->intType;
    rt = pTVar13;
  }
  bVar3 = Type::isIntegral((Type *)local_128);
  if (bVar3) {
    bVar3 = Type::isIntegral(pTVar13);
    uVar20 = (undefined4)CONCAT71(extraout_var,bVar3);
  }
  else {
    uVar20 = 0;
  }
  bVar3 = Type::isNumeric((Type *)local_128);
  if (bVar3) {
    cVar4 = Type::isNumeric(pTVar13);
  }
  else {
    cVar4 = false;
  }
  bVar3 = Expression::isImplicitString(lhs);
  if (bVar3) {
    bVar3 = Expression::isImplicitString(rhs);
  }
  else {
    bVar3 = false;
  }
  BVar18 = op_local;
  uVar26 = (undefined4)((ulong)pSVar23 >> 0x20);
  pCVar9 = (Compilation *)(ulong)op_local;
  if ((Compilation *)0x1b < pCVar9) goto LAB_00635264;
  pTVar16 = (Type *)((long)&switchD_0063466e::switchdataD_008f091c +
                    (long)(int)(&switchD_0063466e::switchdataD_008f091c)[(long)pCVar9]);
  pCVar21 = local_128;
  switch(pCVar9) {
  case (Compilation *)0x0:
  case (Compilation *)0x1:
  case (Compilation *)0x2:
    bVar3 = false;
    goto LAB_00634b3f;
  case (Compilation *)0x3:
    bVar3 = true;
LAB_00634b3f:
    pTVar16 = OpInfo::binaryType(compilation,(Type *)local_128,pTVar13,bVar3,false);
    (expr->super_Expression).type.ptr = pTVar16;
    break;
  case (Compilation *)0x4:
    bVar3 = true;
    goto LAB_00634b10;
  case (Compilation *)0x5:
  case (Compilation *)0x6:
  case (Compilation *)0x7:
  case (Compilation *)0x8:
    bVar3 = false;
LAB_00634b10:
    pTVar16 = OpInfo::binaryType(compilation,(Type *)local_128,pTVar13,bVar3,false);
    (expr->super_Expression).type.ptr = pTVar16;
LAB_00634b21:
    if ((char)uVar20 != '\0') goto LAB_00634c68;
    goto LAB_00635264;
  default:
    if ((bool)cVar4 != false) {
      if (op_local - Equality < 2) {
        local_d0 = lhs;
        pTVar8 = fromComponents::anon_class_1_0_00000001::operator()
                           ((anon_class_1_0_00000001 *)compilation,local_128,pTVar13,pTVar16);
        local_fc._4_4_ = (int)CONCAT71((int7)((ulong)pTVar16 >> 8),1);
      }
      else if (op_local - CaseEquality < 2) {
        pTVar8 = compilation->bitType;
        local_fc._4_4_ = (int)CONCAT71((int7)((ulong)pTVar16 >> 8),1);
        local_d0 = lhs;
      }
      else {
        local_d0 = lhs;
        bVar3 = Type::isFourState((Type *)local_128);
        pTVar8 = compilation->scalarTypeTable[(ulong)bVar3 + 8];
        local_fc._4_4_ = uVar20;
      }
      (expr->super_Expression).type.ptr = pTVar8;
      pTVar16 = OpInfo::binaryType(compilation,(Type *)local_128,pTVar13,false,false);
      opRange_05.startLoc._4_4_ = uVar26;
      opRange_05.startLoc._0_4_ = 1;
      opRange_05.endLoc = in_stack_fffffffffffffed0;
      Expression::contextDetermined
                ((Expression *)context,(ASTContext *)&expr->left_,(Expression **)expr,
                 (Expression *)pTVar16,(Type *)opRange_local.startLoc,opRange_05,
                 opRange_local.endLoc._0_4_);
      pCVar21 = (Compilation *)&expr->right_;
      opRange_06.startLoc._4_4_ = uVar26;
      opRange_06.startLoc._0_4_ = 1;
      opRange_06.endLoc = in_stack_fffffffffffffed0;
      Expression::contextDetermined
                ((Expression *)context,(ASTContext *)pCVar21,(Expression **)expr,
                 (Expression *)pTVar16,(Type *)opRange_local.startLoc,opRange_06,
                 opRange_local.endLoc._0_4_);
      lhs = local_d0;
      cVar4 = local_fc[4];
      break;
    }
    if (bVar3 == false) {
      bVar3 = Type::isAggregate((Type *)local_128);
      if ((bVar3) && (bVar3 = Type::isEquivalent((Type *)local_128,pTVar13), bVar3)) {
        local_fc._4_8_ = pCVar9;
        pTVar16 = fromComponents::anon_class_1_0_00000001::operator()
                            ((anon_class_1_0_00000001 *)compilation,local_128,pTVar13,pTVar16);
      }
      else {
        bVar3 = Type::isClass((Type *)local_128);
        if (((((bVar3) && (bVar3 = Type::isAssignmentCompatible((Type *)local_128,pTVar13), bVar3))
             || ((bVar3 = Type::isClass(pTVar13), bVar3 &&
                 (bVar3 = Type::isAssignmentCompatible(pTVar13,(Type *)local_128), bVar3)))) ||
            (((bVar3 = Type::isCHandle((Type *)local_128), bVar3 ||
              (bVar3 = Type::isNull((Type *)local_128), bVar3)) &&
             ((bVar3 = Type::isCHandle(pTVar13), bVar3 || (bVar3 = Type::isNull(pTVar13), bVar3)))))
            ) || (((((bVar3 = Type::isEvent((Type *)local_128), bVar3 ||
                     (bVar3 = Type::isNull((Type *)local_128), bVar3)) &&
                    ((bVar3 = Type::isEvent(pTVar13), bVar3 ||
                     (bVar3 = Type::isNull(pTVar13), bVar3)))) ||
                   ((((bVar3 = Type::isCovergroup((Type *)local_128), bVar3 ||
                      (bVar3 = Type::isNull((Type *)local_128), bVar3)) &&
                     ((bVar3 = Type::isCovergroup(pTVar13), bVar3 ||
                      (bVar3 = Type::isNull(pTVar13), bVar3)))) ||
                    ((bVar3 = Type::isVirtualInterface((Type *)local_128), bVar3 &&
                     (bVar3 = Type::isAssignmentCompatible((Type *)local_128,pTVar13), bVar3))))))
                  || ((bVar3 = Type::isVirtualInterface(pTVar13), bVar3 &&
                      (bVar3 = Type::isAssignmentCompatible(pTVar13,(Type *)local_128), bVar3))))))
        {
          (expr->super_Expression).type.ptr = compilation->bitType;
          Expression::selfDetermined(context,&expr->left_);
          pCVar21 = (Compilation *)&expr->right_;
          Expression::selfDetermined(context,(Expression **)pCVar21);
          goto LAB_00634c68;
        }
        bVar3 = Type::isTypeRefType((Type *)local_128);
        if ((!bVar3) || (bVar3 = Type::isTypeRefType(pTVar13), !bVar3)) {
          Expression::selfDetermined(context,&expr->left_);
          Expression::selfDetermined(context,&expr->right_);
          goto LAB_00635264;
        }
        pTVar16 = compilation->bitType;
        local_fc._4_8_ = pCVar9;
      }
      (expr->super_Expression).type.ptr = pTVar16;
      Expression::selfDetermined(context,&expr->left_);
      pCVar21 = (Compilation *)&expr->right_;
      Expression::selfDetermined(context,(Expression **)pCVar21);
      BVar18 = local_fc._4_4_;
    }
    else {
      (expr->super_Expression).type.ptr = compilation->bitType;
      opRange_00.startLoc._4_4_ = uVar26;
      opRange_00.startLoc._0_4_ = 1;
      opRange_00.endLoc = in_stack_fffffffffffffed0;
      local_d0 = lhs;
      Expression::contextDetermined
                ((Expression *)context,(ASTContext *)&expr->left_,(Expression **)expr,
                 (Expression *)compilation->stringType,(Type *)opRange_local.startLoc,opRange_00,
                 opRange_local.endLoc._0_4_);
      lhs = local_d0;
      pCVar21 = (Compilation *)&expr->right_;
      opRange_01.startLoc._4_4_ = uVar26;
      opRange_01.startLoc._0_4_ = 1;
      opRange_01.endLoc = in_stack_fffffffffffffed0;
      Expression::contextDetermined
                ((Expression *)context,(ASTContext *)pCVar21,(Expression **)expr,
                 (Expression *)compilation->stringType,(Type *)opRange_local.startLoc,opRange_01,
                 opRange_local.endLoc._0_4_);
    }
    if (LessThan < BVar18) goto LAB_00635264;
    goto LAB_00634c68;
  case (Compilation *)0xd:
  case (Compilation *)0xe:
  case (Compilation *)0xf:
  case (Compilation *)0x10:
    local_fc[4] = cVar4 | bVar3;
    pTVar16 = fromComponents::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)compilation,local_128,pTVar13,pTVar16);
    (expr->super_Expression).type.ptr = pTVar16;
    if (bVar3 == true && (bool)cVar4 == false) {
      pTVar16 = compilation->stringType;
      local_d0 = lhs;
    }
    else {
      local_d0 = lhs;
      pTVar16 = OpInfo::binaryType(compilation,(Type *)local_128,pTVar13,false,false);
    }
    opRange_02.startLoc._4_4_ = uVar26;
    opRange_02.startLoc._0_4_ = 1;
    opRange_02.endLoc = in_stack_fffffffffffffed0;
    Expression::contextDetermined
              ((Expression *)context,(ASTContext *)&expr->left_,(Expression **)expr,
               (Expression *)pTVar16,(Type *)opRange_local.startLoc,opRange_02,
               opRange_local.endLoc._0_4_);
    pCVar21 = (Compilation *)&expr->right_;
    opRange_03.startLoc._4_4_ = uVar26;
    opRange_03.startLoc._0_4_ = 1;
    opRange_03.endLoc = in_stack_fffffffffffffed0;
    Expression::contextDetermined
              ((Expression *)context,(ASTContext *)pCVar21,(Expression **)expr,(Expression *)pTVar16
               ,(Type *)opRange_local.startLoc,opRange_03,opRange_local.endLoc._0_4_);
    lhs = local_d0;
    cVar4 = local_fc[4];
    break;
  case (Compilation *)0x13:
  case (Compilation *)0x14:
  case (Compilation *)0x15:
  case (Compilation *)0x16:
    pTVar16 = fromComponents::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)compilation,local_128,pTVar13,pTVar16);
    (expr->super_Expression).type.ptr = pTVar16;
    Expression::selfDetermined(context,&expr->left_);
    Expression::selfDetermined(context,&expr->right_);
    if ((bool)cVar4 == false) goto LAB_00635264;
    ASTContext::requireBooleanConvertible(context,expr->left_);
    pCVar21 = (Compilation *)expr->right_;
    ASTContext::requireBooleanConvertible(context,(Expression *)pCVar21);
    goto LAB_00634c68;
  case (Compilation *)0x17:
  case (Compilation *)0x18:
  case (Compilation *)0x19:
  case (Compilation *)0x1a:
    bVar3 = Type::isFourState(pTVar13);
    pCVar9 = local_128;
    if (bVar3) {
      pCVar9 = (Compilation *)
               fromComponents::anon_class_1_0_00000001::operator()
                         ((anon_class_1_0_00000001 *)compilation,local_128,forceType);
    }
    (expr->super_Expression).type.ptr = (Type *)pCVar9;
    pCVar21 = (Compilation *)&expr->right_;
    Expression::selfDetermined(context,(Expression **)pCVar21);
    goto LAB_00634b21;
  case (Compilation *)0x1b:
    bVar3 = Type::isFloating((Type *)local_128);
    uVar20 = (undefined4)((ulong)pSVar23 >> 0x20);
    if (!bVar3) {
      bVar3 = Type::isFloating(pTVar13);
      uVar20 = (undefined4)((ulong)pSVar23 >> 0x20);
      if (!bVar3) {
        pTVar16 = fromComponents::anon_class_1_0_00000001::operator()
                            ((anon_class_1_0_00000001 *)compilation,local_128,forceType_00);
        (expr->super_Expression).type.ptr = pTVar16;
        pCVar21 = (Compilation *)&expr->right_;
        Expression::selfDetermined(context,(Expression **)pCVar21);
        break;
      }
    }
    pTVar16 = OpInfo::binaryType(compilation,(Type *)local_128,pTVar13,false,false);
    (expr->super_Expression).type.ptr = pTVar16;
    pCVar21 = (Compilation *)&expr->right_;
    opRange_04.startLoc._4_4_ = uVar20;
    opRange_04.startLoc._0_4_ = 1;
    opRange_04.endLoc = in_stack_fffffffffffffed0;
    Expression::contextDetermined
              ((Expression *)context,(ASTContext *)pCVar21,(Expression **)expr,(Expression *)pTVar16
               ,(Type *)opRange_local.startLoc,opRange_04,opRange_local.endLoc._0_4_);
  }
  if (cVar4 == '\0') {
LAB_00635264:
    sourceRange_02.endLoc = opRange_local.endLoc;
    sourceRange_02.startLoc = opRange_local.startLoc;
    pDVar14 = ASTContext::addDiag(context,(DiagCode)0x1f0007,sourceRange_02);
    pDVar15 = ast::operator<<(pDVar14,(Type *)local_128);
    ast::operator<<(pDVar15,pTVar13);
    Diagnostic::operator<<(pDVar14,lhs->sourceRange);
    Diagnostic::operator<<(pDVar14,rhs->sourceRange);
LAB_00634589:
    expr = (BinaryExpression *)Expression::badExpr(compilation,&expr->super_Expression);
  }
  else {
LAB_00634c68:
    BVar18 = op_local;
    sourceRange_01.endLoc = opRange_local.endLoc;
    sourceRange_01.startLoc = opRange_local.startLoc;
    local_b8.startLoc = opRange_local.startLoc;
    local_b8.endLoc = opRange_local.endLoc;
    local_fc._0_4_ = op_local;
    if (lhs->kind != LValueReference) {
      bVar3 = OpInfo::isBitwise(op_local);
      if (bVar3) {
        pBVar10 = analyzePrecedence::anon_class_1_0_00000001::operator()
                            ((anon_class_1_0_00000001 *)lhs,(Expression *)pCVar21);
        pBVar11 = analyzePrecedence::anon_class_1_0_00000001::operator()
                            ((anon_class_1_0_00000001 *)rhs,(Expression *)pCVar21);
        bVar3 = false;
        if (pBVar10 == (BinaryExpression *)0x0) {
          bVar5 = false;
        }
        else {
          bVar5 = OpInfo::isComparison(pBVar10->op);
        }
        if (pBVar11 != (BinaryExpression *)0x0) {
          bVar3 = OpInfo::isComparison(pBVar11->op);
        }
        if (bVar3 != bVar5) {
          if (pBVar10 == (BinaryExpression *)0x0) {
            bVar3 = false;
          }
          else {
            bVar3 = OpInfo::isBitwise(pBVar10->op);
          }
          if (pBVar11 == (BinaryExpression *)0x0) {
            bVar6 = false;
          }
          else {
            bVar6 = OpInfo::isBitwise(pBVar11->op);
          }
          bVar7 = analyzePrecedence::anon_class_1_0_00000001::operator()
                            ((anon_class_1_0_00000001 *)lhs,(Expression *)pCVar21);
          if (bVar7) {
            bVar7 = analyzePrecedence::anon_class_1_0_00000001::operator()
                              ((anon_class_1_0_00000001 *)rhs,(Expression *)pCVar21);
          }
          else {
            bVar7 = false;
          }
          if ((bVar3 == false && bVar6 == false) && bVar7 == false) {
            sVar25 = OpInfo::getText(BVar18);
            local_a8 = sVar25._M_str;
            local_a0 = sVar25._M_len;
            local_90 = &(lhs->sourceRange).startLoc;
            pBVar24 = pBVar11;
            if (bVar5 != false) {
              pBVar24 = pBVar10;
            }
            pSVar23 = &rhs->sourceRange;
            pEVar12 = rhs;
            if (bVar5 != false) {
              pSVar23 = (SourceRange *)local_90;
              pEVar12 = lhs;
            }
            sVar25 = OpInfo::getText(pBVar24->op);
            arg._M_str = sVar25._M_str;
            local_fc._4_8_ = sVar25._M_len;
            local_98 = (pEVar12->sourceRange).startLoc;
            SVar1 = pSVar23->endLoc;
            pDVar14 = ASTContext::addDiag(context,(DiagCode)0xb80007,sourceRange_01);
            sVar25._M_str = local_a8;
            sVar25._M_len = local_a0;
            pDVar15 = Diagnostic::operator<<(pDVar14,sVar25);
            uVar2 = local_fc._4_8_;
            arg._M_len = local_fc._4_8_;
            pDVar15 = Diagnostic::operator<<(pDVar15,arg);
            arg_00._M_str = arg._M_str;
            arg_00._M_len = uVar2;
            pDVar15 = Diagnostic::operator<<(pDVar15,arg_00);
            range_03.endLoc = SVar1;
            range_03.startLoc = local_98;
            Diagnostic::operator<<(pDVar15,range_03);
            if (bVar5 == false) {
              pEVar12 = pBVar11->left_;
              pSVar17 = local_90;
            }
            else {
              pEVar12 = rhs;
              pSVar17 = &(pBVar10->right_->sourceRange).startLoc;
            }
            range_00.endLoc = (pEVar12->sourceRange).endLoc;
            range_00.startLoc = *pSVar17;
            pDVar15 = Diagnostic::addNote(pDVar14,(DiagCode)0xb20007,range_00);
            arg_01._M_str = local_a8;
            arg_01._M_len = local_a0;
            Diagnostic::operator<<(pDVar15,arg_01);
            range_01.endLoc = SVar1;
            range_01.startLoc = local_98;
            pDVar14 = Diagnostic::addNote(pDVar14,(DiagCode)0xb30007,range_01);
            arg_02._M_str = arg._M_str;
            arg_02._M_len = local_fc._4_8_;
            pCVar21 = (Compilation *)local_fc._4_8_;
            Diagnostic::operator<<(pDVar14,arg_02);
          }
        }
      }
      warnAWithinB.opRange = &local_b8;
      warnAWithinB.context = context;
      warnAWithinB.op = (BinaryOperator *)local_fc;
      if (BVar18 - BinaryOr < 3) {
        check.warnAWithinB = &warnAWithinB;
        check.getBin = &local_d1;
        check.op = (BinaryOperator *)local_fc;
        analyzePrecedence::anon_class_24_3_21991733::operator()(&check,lhs);
        pCVar21 = (Compilation *)rhs;
        analyzePrecedence::anon_class_24_3_21991733::operator()(&check,rhs);
        BVar18 = local_fc._0_4_;
      }
      if (BVar18 == LogicalOr) {
        check.op = (BinaryOperator *)&warnAWithinB;
        check.getBin = &local_d1;
        analyzePrecedence::anon_class_16_2_3ed4ffe4::operator()
                  ((anon_class_16_2_3ed4ffe4 *)&check,lhs);
        pCVar21 = (Compilation *)rhs;
        analyzePrecedence::anon_class_16_2_3ed4ffe4::operator()
                  ((anon_class_16_2_3ed4ffe4 *)&check,rhs);
        BVar18 = local_fc._0_4_;
      }
      bVar3 = OpInfo::isShift(BVar18);
      if (bVar3) {
        check.getBin = &local_d1;
        check.op = (BinaryOperator *)context;
        check.warnAWithinB = (anon_class_24_3_e32f0a13 *)local_fc;
        analyzePrecedence::anon_class_32_4_55ae12ec::operator()
                  ((anon_class_32_4_55ae12ec *)&check,lhs);
        pCVar21 = (Compilation *)rhs;
        analyzePrecedence::anon_class_32_4_55ae12ec::operator()
                  ((anon_class_32_4_55ae12ec *)&check,rhs);
      }
      bVar3 = OpInfo::isComparison(local_fc._0_4_);
      if (((((local_fc._0_4_ == BinaryAnd || bVar3) && (lhs->kind == UnaryOp)) &&
           (bVar3 = Expression::isParenthesized(lhs), !bVar3)) &&
          ((lhs[1].kind == HierarchicalValue &&
           (bVar3 = analyzePrecedence::anon_class_1_0_00000001::operator()
                              ((anon_class_1_0_00000001 *)lhs[1].syntax,(Expression *)pCVar21),
           !bVar3)))) &&
         (bVar3 = analyzePrecedence::anon_class_1_0_00000001::operator()
                            ((anon_class_1_0_00000001 *)rhs,(Expression *)pCVar21), !bVar3)) {
        pcVar19 = "comparison";
        if (local_fc._0_4_ == BinaryAnd) {
          pcVar19 = "bitwise operator";
        }
        sVar22 = 10;
        if (local_fc._0_4_ == BinaryAnd) {
          sVar22 = 0x10;
        }
        sourceRange_00.startLoc = *(SourceLocation *)&lhs[1].type;
        sourceRange_00.endLoc = (SourceLocation)lhs[1].constant;
        pDVar14 = ASTContext::addDiag(context,(DiagCode)0xc80007,sourceRange_00);
        arg_03._M_str = pcVar19;
        arg_03._M_len = sVar22;
        pDVar15 = Diagnostic::operator<<(pDVar14,arg_03);
        range.endLoc = local_b8.endLoc;
        range.startLoc = local_b8.startLoc;
        Diagnostic::operator<<(pDVar15,range);
        range_02.endLoc = (rhs->sourceRange).endLoc;
        range_02.startLoc = (SourceLocation)lhs[1].syntax[1].super_SyntaxNode.parent;
        pDVar15 = Diagnostic::addNote(pDVar14,(DiagCode)0xb00007,range_02);
        arg_04._M_str = pcVar19;
        arg_04._M_len = sVar22;
        Diagnostic::operator<<(pDVar15,arg_04);
        pCVar21 = (Compilation *)&uleb128_00b10007;
        Diagnostic::addNote(pDVar14,(DiagCode)0xb10007,lhs->sourceRange);
      }
      bVar3 = OpInfo::isRelational(local_fc._0_4_);
      if (((bVar3) &&
          (pBVar10 = analyzePrecedence::anon_class_1_0_00000001::operator()
                               ((anon_class_1_0_00000001 *)lhs,(Expression *)pCVar21),
          pBVar10 != (BinaryExpression *)0x0)) && (bVar3 = OpInfo::isRelational(pBVar10->op), bVar3)
         ) {
        sourceRange_03.endLoc = local_b8.endLoc;
        sourceRange_03.startLoc = local_b8.startLoc;
        ASTContext::addDiag(context,(DiagCode)0xbd0007,sourceRange_03);
      }
      local_128 = (Compilation *)lt;
    }
    pTVar13 = Type::getCanonicalType((Type *)local_128);
    pTVar16 = Type::getCanonicalType(rt);
    bVar3 = Type::isMatching(pTVar13,pTVar16);
    if ((!bVar3) && (check.warnAWithinB = (anon_class_24_3_e32f0a13 *)&lt, op_local < LogicalAnd)) {
      if ((0x7fe00U >> (op_local & (LogicalShiftRight|BinaryXor)) & 1) == 0) {
        if ((0x1fU >> (op_local & (LogicalShiftRight|BinaryXor)) & 1) == 0) {
          code.subsystem = Expressions;
          code.code = 0xb6;
        }
        else {
          code.subsystem = Expressions;
          code.code = 0xb5;
        }
        bVar3 = false;
      }
      else {
        bVar3 = true;
        code.subsystem = Expressions;
        code.code = 0xbb;
      }
      check.getBin = (anon_class_1_0_00000001 *)pTVar13;
      check.op = (BinaryOperator *)pTVar16;
      fromComponents::anon_class_64_8_451f4118::operator()
                ((anon_class_64_8_451f4118 *)&check,code,bVar3);
    }
  }
  return &expr->super_Expression;
}

Assistant:

Expression& BinaryExpression::fromComponents(Expression& lhs, Expression& rhs, BinaryOperator op,
                                             SourceRange opRange, SourceRange sourceRange,
                                             const ASTContext& context) {
    auto& compilation = context.getCompilation();
    const Type* lt = lhs.type;
    const Type* rt = rhs.type;

    auto result = compilation.emplace<BinaryExpression>(op, *lt, lhs, rhs, sourceRange, opRange);
    if (lhs.bad() || rhs.bad())
        return badExpr(compilation, result);

    if (lt->isUnbounded())
        lt = &compilation.getIntType();
    if (rt->isUnbounded())
        rt = &compilation.getIntType();

    bool bothIntegral = lt->isIntegral() && rt->isIntegral();
    bool bothNumeric = lt->isNumeric() && rt->isNumeric();
    bool bothStrings = lhs.isImplicitString() && rhs.isImplicitString();

    auto forceFourState = [](Compilation& compilation, const Type* forceType) {
        if (forceType->isFloating() || forceType->isFourState())
            return forceType;

        // Use the logic in binaryOperatorType to create a type with the correct size and sign.
        return OpInfo::binaryType(compilation, forceType, forceType, true);
    };

    auto singleBitType = [](Compilation& compilation, const Type* lt, const Type* rt) {
        if (lt->isFourState() || rt->isFourState())
            return &compilation.getLogicType();
        return &compilation.getBitType();
    };

    bool good = false;
    switch (op) {
        case BinaryOperator::Add:
        case BinaryOperator::Subtract:
        case BinaryOperator::Multiply:
            good = bothNumeric;
            result->type = OpInfo::binaryType(compilation, lt, rt, false);
            break;
        case BinaryOperator::Divide:
            // Result is forced to 4-state because result can be X.
            good = bothNumeric;
            result->type = OpInfo::binaryType(compilation, lt, rt, true);
            break;
        case BinaryOperator::Mod:
            // Result is forced to 4-state because result can be X.
            // Different from divide because only integers are allowed.
            good = bothIntegral;
            result->type = OpInfo::binaryType(compilation, lt, rt, true);
            break;
        case BinaryOperator::BinaryAnd:
        case BinaryOperator::BinaryOr:
        case BinaryOperator::BinaryXor:
        case BinaryOperator::BinaryXnor:
            good = bothIntegral;
            result->type = OpInfo::binaryType(compilation, lt, rt, false);
            break;
        case BinaryOperator::LogicalShiftLeft:
        case BinaryOperator::LogicalShiftRight:
        case BinaryOperator::ArithmeticShiftLeft:
        case BinaryOperator::ArithmeticShiftRight:
            // The result is always the same type as the lhs, except that if the rhs is
            // four state then the lhs also becomes four state.
            good = bothIntegral;
            if (rt->isFourState())
                result->type = forceFourState(compilation, lt);
            else
                result->type = lt;
            selfDetermined(context, result->right_);
            break;
        case BinaryOperator::Power:
            good = bothNumeric;
            if (lt->isFloating() || rt->isFloating()) {
                result->type = OpInfo::binaryType(compilation, lt, rt, false);
                contextDetermined(context, result->right_, result, *result->type, opRange);
            }
            else {
                // Result is forced to 4-state because result can be X.
                result->type = forceFourState(compilation, lt);
                selfDetermined(context, result->right_);
            }
            break;
        case BinaryOperator::GreaterThanEqual:
        case BinaryOperator::GreaterThan:
        case BinaryOperator::LessThanEqual:
        case BinaryOperator::LessThan: {
            // Result is always a single bit.
            good = bothNumeric || bothStrings;
            result->type = singleBitType(compilation, lt, rt);

            // Result type is fixed but the two operands affect each other as they would in
            // other context-determined operators.
            auto nt = (good && !bothNumeric) ? &compilation.getStringType()
                                             : OpInfo::binaryType(compilation, lt, rt, false);
            contextDetermined(context, result->left_, result, *nt, opRange);
            contextDetermined(context, result->right_, result, *nt, opRange);
            break;
        }
        case BinaryOperator::LogicalAnd:
        case BinaryOperator::LogicalOr:
        case BinaryOperator::LogicalImplication:
        case BinaryOperator::LogicalEquivalence:
            // Result is always a single bit.
            good = bothNumeric;
            result->type = singleBitType(compilation, lt, rt);
            selfDetermined(context, result->left_);
            selfDetermined(context, result->right_);
            if (good) {
                // Call this just to get warnings about boolean conversions.
                context.requireBooleanConvertible(*result->left_);
                context.requireBooleanConvertible(*result->right_);
            }
            break;
        case BinaryOperator::Equality:
        case BinaryOperator::Inequality:
        case BinaryOperator::WildcardEquality:
        case BinaryOperator::WildcardInequality:
        case BinaryOperator::CaseEquality:
        case BinaryOperator::CaseInequality:
            // Two types are comparable if:
            // - they are both integral or floating
            // - both classes or null, and assignment compatible
            // - both chandles or null
            // - both aggregates and equivalent
            if (bothNumeric) {
                // For equality and inequality, result is four state if either operand is
                // four state. For case equality and case inequality, result is never four
                // state. For wildcard equality / inequality, result is four state only if
                // lhs is four state.
                if (op == BinaryOperator::Equality || op == BinaryOperator::Inequality) {
                    good = true;
                    result->type = singleBitType(compilation, lt, rt);
                }
                else if (op == BinaryOperator::CaseEquality ||
                         op == BinaryOperator::CaseInequality) {
                    good = true;
                    result->type = &compilation.getBitType();
                }
                else {
                    good = bothIntegral;
                    result->type = lt->isFourState() ? &compilation.getLogicType()
                                                     : &compilation.getBitType();
                }

                // Result type is fixed but the two operands affect each other as they would
                // in other context-determined operators.
                auto nt = OpInfo::binaryType(compilation, lt, rt, false);
                contextDetermined(context, result->left_, result, *nt, opRange);
                contextDetermined(context, result->right_, result, *nt, opRange);
            }
            else {
                bool isContext = false;
                bool isWildcard = op == BinaryOperator::WildcardEquality ||
                                  op == BinaryOperator::WildcardInequality;

                if (bothStrings) {
                    good = !isWildcard;
                    result->type = &compilation.getBitType();

                    // If there is a literal involved, make sure it's converted to string.
                    isContext = true;
                    contextDetermined(context, result->left_, result, compilation.getStringType(),
                                      opRange);
                    contextDetermined(context, result->right_, result, compilation.getStringType(),
                                      opRange);
                }
                else if (lt->isAggregate() && lt->isEquivalent(*rt)) {
                    good = !isWildcard;
                    result->type = singleBitType(compilation, lt, rt);
                }
                else if ((lt->isClass() && lt->isAssignmentCompatible(*rt)) ||
                         (rt->isClass() && rt->isAssignmentCompatible(*lt))) {
                    good = true;
                    result->type = &compilation.getBitType();
                }
                else if ((lt->isCHandle() || lt->isNull()) && (rt->isCHandle() || rt->isNull())) {
                    good = true;
                    result->type = &compilation.getBitType();
                }
                else if ((lt->isEvent() || lt->isNull()) && (rt->isEvent() || rt->isNull())) {
                    good = true;
                    result->type = &compilation.getBitType();
                }
                else if ((lt->isCovergroup() || lt->isNull()) &&
                         (rt->isCovergroup() || rt->isNull())) {
                    good = true;
                    result->type = &compilation.getBitType();
                }
                else if ((lt->isVirtualInterface() && lt->isAssignmentCompatible(*rt)) ||
                         (rt->isVirtualInterface() && rt->isAssignmentCompatible(*lt))) {
                    good = true;
                    result->type = &compilation.getBitType();
                }
                else if (lt->isTypeRefType() && rt->isTypeRefType()) {
                    good = !isWildcard;
                    result->type = &compilation.getBitType();
                }
                else {
                    good = false;
                }

                if (!isContext) {
                    selfDetermined(context, result->left_);
                    selfDetermined(context, result->right_);
                }
            }
            break;
    }

    if (!good) {
        auto& diag = context.addDiag(diag::BadBinaryExpression, opRange);
        diag << *lt << *rt;
        diag << lhs.sourceRange;
        diag << rhs.sourceRange;
        return badExpr(compilation, result);
    }

    analyzePrecedence(context, lhs, rhs, op, opRange);

    auto& clt = lt->getCanonicalType();
    auto& crt = rt->getCanonicalType();
    if (!clt.isMatching(crt)) {
        auto checkTypes = [&](DiagCode code, bool isComparison) {
            analyzeOpTypes(clt, crt, *lt, *rt, lhs, rhs, context, opRange, code, isComparison, {});
        };

        switch (op) {
            case BinaryOperator::Add:
            case BinaryOperator::Subtract:
            case BinaryOperator::Multiply:
            case BinaryOperator::Divide:
            case BinaryOperator::Mod:
                checkTypes(diag::ArithOpMismatch, false);
                break;
            case BinaryOperator::BinaryAnd:
            case BinaryOperator::BinaryOr:
            case BinaryOperator::BinaryXor:
            case BinaryOperator::BinaryXnor:
                checkTypes(diag::BitwiseOpMismatch, false);
                break;
            case BinaryOperator::Equality:
            case BinaryOperator::Inequality:
            case BinaryOperator::CaseEquality:
            case BinaryOperator::CaseInequality:
            case BinaryOperator::GreaterThanEqual:
            case BinaryOperator::GreaterThan:
            case BinaryOperator::LessThanEqual:
            case BinaryOperator::LessThan:
            case BinaryOperator::WildcardEquality:
            case BinaryOperator::WildcardInequality:
                checkTypes(diag::ComparisonMismatch, true);
                break;
            default:
                // Remaining operations have self determined
                // operands so the warning wouldn't make sense.
                break;
        }
    }

    return *result;
}